

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

float direction_magnitude(vw *all)

{
  long in_RDI;
  dense_parameters *in_stack_00000028;
  vw *in_stack_00000030;
  sparse_parameters *in_stack_00000038;
  vw *in_stack_00000040;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0x3590) & 1) == 0) {
    local_4 = direction_magnitude<dense_parameters>(in_stack_00000030,in_stack_00000028);
  }
  else {
    local_4 = direction_magnitude<sparse_parameters>(in_stack_00000040,in_stack_00000038);
  }
  return local_4;
}

Assistant:

float direction_magnitude(vw& all)
{
  // compute direction magnitude
  if (all.weights.sparse)
    return direction_magnitude(all, all.weights.sparse_weights);
  else
    return direction_magnitude(all, all.weights.dense_weights);
}